

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall
QLocale::toCurrencyString(QLocale *this,double value,QString *symbol,int precision)

{
  QStringView v;
  QAnyStringView s;
  QAnyStringView s_00;
  QAnyStringView pattern;
  bool bVar1;
  QLocalePrivate *pQVar2;
  int in_ECX;
  QLocale *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  QStringView QVar3;
  QString *res;
  QString sym;
  QString str;
  DataRange range;
  CurrencyToStringArgument arg;
  ArgBase *argBases [3];
  QVariant *in_stack_fffffffffffffd68;
  CurrencyToStringArgument *in_stack_fffffffffffffd70;
  undefined1 *puVar4;
  CurrencyToStringArgument *in_stack_fffffffffffffd78;
  undefined1 *puVar5;
  CurrencyToStringArgument *in_stack_fffffffffffffd80;
  DataRange *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd90;
  QSystemLocale *in_stack_fffffffffffffda0;
  QString *pQVar6;
  double local_210;
  ArgBase **args;
  undefined1 **numArgs;
  ArgBase *local_198;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar7;
  undefined1 *puVar8;
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  DataRange local_168;
  DataRange local_160;
  undefined1 local_148 [40];
  undefined1 local_120 [24];
  QStringView local_108;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [32];
  undefined1 local_a8 [64];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4da840);
  if (pQVar2->m_data == &systemLocaleData) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant(&in_stack_fffffffffffffd70->value,(double)in_stack_fffffffffffffd78);
    QSystemLocale::CurrencyToStringArgument::CurrencyToStringArgument
              (in_stack_fffffffffffffd80,&in_stack_fffffffffffffd78->value,
               (QString *)in_stack_fffffffffffffd70);
    ::QVariant::~QVariant(&in_stack_fffffffffffffd70->value);
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    in_stack_fffffffffffffda0 = systemLocale();
    ::QVariant::fromValue<QSystemLocale::CurrencyToStringArgument>(in_stack_fffffffffffffd78);
    (*in_stack_fffffffffffffda0->_vptr_QSystemLocale[2])
              (local_a8,in_stack_fffffffffffffda0,0x20,local_c8);
    ::QVariant::toString(in_stack_fffffffffffffd68);
    ::QVariant::~QVariant(&in_stack_fffffffffffffd70->value);
    ::QVariant::~QVariant(&in_stack_fffffffffffffd70->value);
    bVar1 = QString::isEmpty((QString *)0x4da967);
    if (bVar1) {
      QString::~QString((QString *)0x4daa14);
    }
    QSystemLocale::CurrencyToStringArgument::~CurrencyToStringArgument(in_stack_fffffffffffffd70);
    if (!bVar1) goto LAB_004dae70;
  }
  local_160 = (DataRange)&DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4daa5d);
  local_160 = QLocaleData::currencyFormatNegative(pQVar2->m_data);
  if ((local_160.size == 0) || (0.0 <= in_XMM0_Qa)) {
    pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                       ((QSharedDataPointer<QLocalePrivate> *)0x4daa93);
    local_168 = QLocaleData::currencyFormat(pQVar2->m_data);
    local_210 = in_XMM0_Qa;
    local_160 = local_168;
  }
  else {
    local_210 = -in_XMM0_Qa;
  }
  local_180 = &DAT_aaaaaaaaaaaaaaaa;
  local_178 = &DAT_aaaaaaaaaaaaaaaa;
  local_170 = &DAT_aaaaaaaaaaaaaaaa;
  if (in_ECX == -1) {
    QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4dab2b);
    in_ECX = 0;
  }
  toString((QLocale *)in_stack_fffffffffffffda0,local_210,(char)((uint)in_ECX >> 0x18),
           in_stack_fffffffffffffd90);
  puVar8 = &DAT_aaaaaaaaaaaaaaaa;
  local_198 = (ArgBase *)&DAT_aaaaaaaaaaaaaaaa;
  aVar7.m_data = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QString::isNull((QString *)0x4dab94);
  if (bVar1) {
    currencySymbol(in_RSI,(CurrencySymbolFormat)((ulong)pQVar6 >> 0x20));
  }
  else {
    QString::QString((QString *)in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
  }
  bVar1 = QString::isEmpty((QString *)0x4dabe1);
  if (bVar1) {
    currencySymbol(in_RSI,(CurrencySymbolFormat)((ulong)pQVar6 >> 0x20));
    QString::operator=((QString *)in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QString::~QString((QString *)0x4dac1f);
  }
  QVar3 = QLocaleData::DataRange::viewData
                    (in_stack_fffffffffffffd88,(char16_t *)in_stack_fffffffffffffd80);
  numArgs = &local_180;
  args = &local_198;
  v.m_data = (storage_type_conflict *)QVar3.m_size;
  v.m_size = (qsizetype)QVar3.m_data;
  local_108 = QVar3;
  QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffffd78,v);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)QVar3.m_data,(QString *)in_stack_fffffffffffffd78);
  puVar4 = local_120;
  s.m_size = QVar3.m_size;
  s.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
              (anon_union_8_3_8ad491a7_for_QAnyStringView_6)QVar3.m_data;
  QtPrivate::qStringLikeToArg(s);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)QVar3.m_data,(QString *)in_stack_fffffffffffffd78);
  puVar5 = local_148;
  s_00.m_size = QVar3.m_size;
  s_00.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
                 (anon_union_8_3_8ad491a7_for_QAnyStringView_6)QVar3.m_data;
  QtPrivate::qStringLikeToArg(s_00);
  local_d8 = local_f8;
  uStack_d0 = local_f0;
  local_18 = 0;
  local_e8 = local_f8;
  uStack_e0 = local_f0;
  pattern.m_size = (size_t)puVar8;
  pattern.field_0.m_data = aVar7.m_data;
  local_28 = puVar4;
  puStack_20 = puVar5;
  QtPrivate::argToQString(pattern,(size_t)numArgs,args);
  QString::~QString((QString *)0x4dae52);
  QString::~QString((QString *)0x4dae5f);
LAB_004dae70:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar6;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::toCurrencyString(double value, const QString &symbol, int precision) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QSystemLocale::CurrencyToStringArgument arg(value, symbol);
        auto res = systemLocale()->query(QSystemLocale::CurrencyToString,
                                         QVariant::fromValue(arg)).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    QLocaleData::DataRange range = d->m_data->currencyFormatNegative();
    if (!range.size || value >= 0)
        range = d->m_data->currencyFormat();
    else
        value = -value;
    QString str = toString(value, 'f', precision == -1 ? d->m_data->m_currency_digits : precision);
    QString sym = symbol.isNull() ? currencySymbol() : symbol;
    if (sym.isEmpty())
        sym = currencySymbol(CurrencyIsoCode);
    return range.viewData(currency_format_data).arg(str, sym);
}